

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue * build_arg_list(JSContext *ctx,uint32_t *plen,JSValue array_arg)

{
  JSValue this_obj;
  int iVar1;
  int in_ECX;
  long in_RDX;
  uint *in_RSI;
  JSContext *in_RDI;
  JSValue JVar2;
  JSObject *p;
  JSValue ret;
  JSValue *tab;
  uint32_t i;
  uint32_t len;
  JSValue *in_stack_ffffffffffffff58;
  JSContext *in_stack_ffffffffffffff60;
  JSValueUnion *pJVar3;
  JSContext *pJVar4;
  JSValueUnion in_stack_ffffffffffffff70;
  JSValueUnion in_stack_ffffffffffffff78;
  JSContext *in_stack_ffffffffffffff80;
  JSValueUnion in_stack_ffffffffffffff88;
  int64_t in_stack_ffffffffffffff90;
  uint local_30;
  uint local_2c;
  JSValue *local_8;
  
  if (in_ECX == -1) {
    JVar2.tag = in_stack_ffffffffffffff90;
    JVar2.u.float64 = in_stack_ffffffffffffff88.float64;
    iVar1 = js_get_length32(in_stack_ffffffffffffff80,(uint32_t *)in_stack_ffffffffffffff78.ptr,
                            JVar2);
    if (iVar1 == 0) {
      if (local_2c < 0x10001) {
        pJVar4 = in_RDI;
        max_uint32(1,local_2c);
        local_8 = (JSValue *)
                  js_mallocz((JSContext *)in_stack_ffffffffffffff78.ptr,
                             (size_t)in_stack_ffffffffffffff70);
        if (local_8 == (JSValue *)0x0) {
          local_8 = (JSValue *)0x0;
        }
        else {
          if ((((*(short *)(in_RDX + 6) == 2) || (*(short *)(in_RDX + 6) == 8)) &&
              ((*(byte *)(in_RDX + 5) >> 3 & 1) != 0)) && (local_2c == *(uint *)(in_RDX + 0x40))) {
            for (local_30 = 0; local_30 < local_2c; local_30 = local_30 + 1) {
              pJVar3 = &local_8[local_30].u;
              JVar2 = JS_DupValue(in_RDI,*(JSValue *)
                                          (*(long *)(in_RDX + 0x38) + (ulong)local_30 * 0x10));
              *pJVar3 = JVar2.u;
              pJVar3[1] = (JSValueUnion)JVar2.tag;
            }
          }
          else {
            for (local_30 = 0; local_30 < local_2c; local_30 = local_30 + 1) {
              this_obj.tag = (int64_t)in_stack_ffffffffffffff80;
              this_obj.u.ptr = in_stack_ffffffffffffff78.ptr;
              JVar2 = JS_GetPropertyUint32
                                ((JSContext *)in_stack_ffffffffffffff70.ptr,this_obj,
                                 (uint32_t)((ulong)pJVar4 >> 0x20));
              in_stack_ffffffffffffff70 = JVar2.u;
              in_stack_ffffffffffffff78 = (JSValueUnion)JVar2.tag;
              iVar1 = JS_IsException(JVar2);
              if (iVar1 != 0) {
                free_arg_list(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,0);
                return (JSValue *)0x0;
              }
              local_8[local_30].u.ptr = (void *)JVar2.u;
              (&local_8[local_30].u)[1].ptr = (void *)JVar2.tag;
            }
          }
          *in_RSI = local_2c;
        }
      }
      else {
        JS_ThrowInternalError(in_RDI,"too many arguments");
        local_8 = (JSValue *)0x0;
      }
    }
    else {
      local_8 = (JSValue *)0x0;
    }
  }
  else {
    JS_ThrowTypeError(in_RDI,"not a object");
    local_8 = (JSValue *)0x0;
  }
  return local_8;
}

Assistant:

static JSValue *build_arg_list(JSContext *ctx, uint32_t *plen,
                               JSValueConst array_arg)
{
    uint32_t len, i;
    JSValue *tab, ret;
    JSObject *p;

    if (JS_VALUE_GET_TAG(array_arg) != JS_TAG_OBJECT) {
        JS_ThrowTypeError(ctx, "not a object");
        return NULL;
    }
    if (js_get_length32(ctx, &len, array_arg))
        return NULL;
    if (len > JS_MAX_LOCAL_VARS) {
        JS_ThrowInternalError(ctx, "too many arguments");
        return NULL;
    }
    /* avoid allocating 0 bytes */
    tab = js_mallocz(ctx, sizeof(tab[0]) * max_uint32(1, len));
    if (!tab)
        return NULL;
    p = JS_VALUE_GET_OBJ(array_arg);
    if ((p->class_id == JS_CLASS_ARRAY || p->class_id == JS_CLASS_ARGUMENTS) &&
        p->fast_array &&
        len == p->u.array.count) {
        for(i = 0; i < len; i++) {
            tab[i] = JS_DupValue(ctx, p->u.array.u.values[i]);
        }
    } else {
        for(i = 0; i < len; i++) {
            ret = JS_GetPropertyUint32(ctx, array_arg, i);
            if (JS_IsException(ret)) {
                free_arg_list(ctx, tab, i);
                return NULL;
            }
            tab[i] = ret;
        }
    }
    *plen = len;
    return tab;
}